

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * msort(char *list,char **next,_func_int_char_ptr_char_ptr *cmp)

{
  char **ppcVar1;
  long lVar2;
  bool bVar3;
  int local_12c;
  int i;
  char *set [30];
  char **local_30;
  char *ep;
  unsigned_long offset;
  _func_int_char_ptr_char_ptr *cmp_local;
  char **next_local;
  char *list_local;
  
  lVar2 = (long)next - (long)list;
  for (local_12c = 0; next_local = (char **)list, local_12c < 0x1e; local_12c = local_12c + 1) {
    set[(long)local_12c + -1] = (char *)0x0;
  }
  while (next_local != (char **)0x0) {
    local_30 = next_local;
    ppcVar1 = *(char ***)((long)next_local + lVar2);
    *(undefined8 *)((long)next_local + lVar2) = 0;
    local_12c = 0;
    while( true ) {
      bVar3 = false;
      if (local_12c < 0x1d) {
        bVar3 = set[(long)local_12c + -1] != (char *)0x0;
      }
      if (!bVar3) break;
      local_30 = (char **)merge((char *)local_30,set[(long)local_12c + -1],cmp,(int)lVar2);
      set[(long)local_12c + -1] = (char *)0x0;
      local_12c = local_12c + 1;
    }
    set[(long)local_12c + -1] = (char *)local_30;
    next_local = ppcVar1;
  }
  local_30 = (char **)0x0;
  for (local_12c = 0; local_12c < 0x1e; local_12c = local_12c + 1) {
    if (set[(long)local_12c + -1] != (char *)0x0) {
      local_30 = (char **)merge(set[(long)local_12c + -1],(char *)local_30,cmp,(int)lVar2);
    }
  }
  return (char *)local_30;
}

Assistant:

static char *msort(
  char *list,
  char **next,
  int (*cmp)(const char*,const char*)
){
  unsigned long offset;
  char *ep;
  char *set[LISTSIZE];
  int i;
  offset = (unsigned long)((char*)next - (char*)list);
  for(i=0; i<LISTSIZE; i++) set[i] = 0;
  while( list ){
    ep = list;
    list = NEXT(list);
    NEXT(ep) = 0;
    for(i=0; i<LISTSIZE-1 && set[i]!=0; i++){
      ep = merge(ep,set[i],cmp,offset);
      set[i] = 0;
    }
    set[i] = ep;
  }
  ep = 0;
  for(i=0; i<LISTSIZE; i++) if( set[i] ) ep = merge(set[i],ep,cmp,offset);
  return ep;
}